

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcSymbol * __thiscall CTcSymLocalBase::new_ctx_var(CTcSymLocalBase *this)

{
  CTcTokenizer *pCVar1;
  ushort uVar2;
  CVmHashEntry *this_00;
  int iVar3;
  
  this_00 = (CVmHashEntry *)CTcPrsMem::alloc(G_prsmem,0x68);
  CVmHashEntry::CVmHashEntry
            (this_00,(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                     super_CVmHashEntry.str_,
             (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
             len_,0);
  *(undefined4 *)&this_00->field_0x24 = 4;
  this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00351e28;
  uVar2 = *(ushort *)((long)&this_00[2].str_ + 4) & 0xfe00;
  this_00[1].str_ = (char *)0x0;
  this_00[1].len_ = 0;
  this_00[2]._vptr_CVmHashEntry = (_func_int **)0x0;
  this_00[2].nxt_ = (CVmHashEntry *)0x0;
  *(ushort *)((long)&this_00[2].str_ + 4) = uVar2;
  pCVar1 = G_tok;
  this_00[1]._vptr_CVmHashEntry = (_func_int **)G_tok->last_desc_;
  this_00[1].nxt_ = (CVmHashEntry *)pCVar1->last_linenum_;
  this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0035bbd0;
  this_00[2]._vptr_CVmHashEntry = (_func_int **)this;
  iVar3 = 1;
  if ((*(ushort *)&this->field_0x64 & 0x10) != 0) {
    iVar3 = this->ctx_level_ + 1;
  }
  *(ushort *)((long)&this_00[2].str_ + 4) = uVar2 | 0x10;
  *(int *)((long)&this_00[1].len_ + 4) = iVar3;
  *(undefined4 *)&this_00[1].field_0x20 = 0;
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymLocalBase::new_ctx_var() const
{
    /* create a new local with the same name */
    CTcSymLocal *lcl = new CTcSymLocal(
        get_sym(), get_sym_len(), FALSE, FALSE, 0);

    /* refer the copy back to the original (i.e., me) */
    lcl->set_ctx_orig((CTcSymLocal *)this);

    /* set up the context variable information */
    if (!is_ctx_local_)
    {
        /* 
         *   The original is a true local - we're at the first context
         *   level, and we don't yet have a property assigned, since we
         *   don't know if this variable is actually going to be
         *   referenced. 
         */
        lcl->set_ctx_level(1);
    }
    else
    {
        /* 
         *   The original was already a context variable - we're at one
         *   higher context level in this function, and we use the same
         *   context property as the original did.  
         */
        lcl->set_ctx_level(ctx_level_ + 1);
    }

    /* return the new symbol */
    return lcl;
}